

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  size_t *psVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  unsigned_long uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_var [56];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  undefined1 auVar52 [16];
  float fVar54;
  undefined1 auVar53 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [64];
  float fVar67;
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar72 [64];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar53._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar53._8_56_ = extraout_var;
  auVar32._8_8_ = 0;
  auVar32._0_4_ = time_range->lower;
  auVar32._4_4_ = time_range->upper;
  auVar25 = auVar53._0_16_;
  auVar71 = vcmpps_avx(auVar25,auVar32,1);
  auVar7 = vblendps_avx(auVar32,auVar25,2);
  auVar25 = vinsertps_avx(auVar25,auVar32,0x50);
  auVar7 = vblendvps_avx(auVar25,auVar7,auVar71);
  auVar71 = vmovshdup_avx(auVar7);
  fVar67 = auVar71._0_4_;
  if (auVar7._0_4_ <= fVar67) {
    uVar12 = r->_begin;
    uVar19 = r->_end;
    if (uVar12 < uVar19) {
      auVar71._8_4_ = 0xff800000;
      auVar71._0_8_ = 0xff800000ff800000;
      auVar71._12_4_ = 0xff800000;
      auVar72 = ZEXT1664(auVar71);
      auVar25._8_4_ = 0x7f800000;
      auVar25._0_8_ = 0x7f8000007f800000;
      auVar25._12_4_ = 0x7f800000;
      auVar76 = ZEXT1664(auVar25);
      sVar11 = 0;
      auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar68 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar69 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar62 = ZEXT1664(auVar25);
      auVar66 = ZEXT1664(auVar71);
      do {
        auVar25 = auVar53._0_16_;
        BVar2 = (this->super_LineSegments).super_Geometry.time_range;
        auVar26._8_8_ = 0;
        auVar26._0_4_ = BVar2.lower;
        auVar26._4_4_ = BVar2.upper;
        auVar71 = vmovshdup_avx(auVar26);
        fVar31 = BVar2.lower;
        fVar10 = auVar71._0_4_ - fVar31;
        uVar3 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                         *(long *)&(this->super_LineSegments).field_0x68 * uVar12);
        uVar15 = (ulong)uVar3;
        uVar16 = (ulong)(uVar3 + 1);
        pBVar4 = (this->super_LineSegments).vertices.items;
        if (uVar16 < (pBVar4->super_RawBufferView).num) {
          fVar24 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
          auVar32 = ZEXT416((uint)(fVar24 * ((fVar67 - fVar31) / fVar10) * 0.99999976));
          auVar32 = vroundss_avx(auVar32,auVar32,10);
          auVar26 = vminss_avx(auVar32,ZEXT416((uint)fVar24));
          fVar70 = auVar7._0_4_ - fVar31;
          auVar32 = ZEXT416((uint)(fVar24 * (fVar70 / fVar10) * 1.0000002));
          auVar32 = vroundss_avx(auVar32,auVar32,9);
          auVar32 = vmaxss_avx(auVar25,auVar32);
          if ((uint)(int)auVar32._0_4_ <= (uint)(int)auVar26._0_4_) {
            uVar20 = (ulong)(int)auVar32._0_4_;
            psVar14 = &pBVar4[uVar20].super_RawBufferView.stride;
            do {
              auVar25 = *(undefined1 (*) [16])
                         (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar15);
              auVar32 = vcmpps_avx(auVar25,auVar68._0_16_,2);
              auVar73 = vcmpps_avx(auVar25,auVar69._0_16_,5);
              auVar32 = vorps_avx(auVar32,auVar73);
              if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar32[0xf] < '\0') goto LAB_0198ed5c;
              auVar32 = *(undefined1 (*) [16])
                         (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar16);
              auVar73 = vcmpps_avx(auVar32,auVar68._0_16_,2);
              auVar51 = vcmpps_avx(auVar32,auVar69._0_16_,5);
              auVar73 = vorps_avx(auVar73,auVar51);
              if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar73[0xf] < '\0') {
                auVar53 = ZEXT864(0) << 0x40;
                goto LAB_0198ed5c;
              }
              auVar25 = vshufps_avx(auVar25,auVar25,0xff);
              auVar32 = vshufps_avx(auVar32,auVar32,0xff);
              auVar32 = vminss_avx(auVar25,auVar32);
              auVar25 = ZEXT816(0) << 0x20;
              auVar53 = ZEXT864(0) << 0x20;
              if (auVar32._0_4_ < 0.0) goto LAB_0198ed5c;
              uVar20 = uVar20 + 1;
              psVar14 = psVar14 + 7;
            } while (uVar20 <= (ulong)(long)(int)auVar26._0_4_);
          }
          fVar37 = auVar71._0_4_ - fVar31;
          fVar70 = fVar70 / fVar37;
          fVar37 = (fVar67 - fVar31) / fVar37;
          fVar10 = fVar24 * fVar70;
          fVar31 = fVar24 * fVar37;
          auVar32 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),9);
          auVar26 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),10);
          auVar71 = vmaxss_avx(auVar32,auVar25);
          auVar25 = vminss_avx(auVar26,ZEXT416((uint)fVar24));
          fVar43 = auVar25._0_4_;
          iVar17 = (int)auVar32._0_4_;
          if (iVar17 < 0) {
            iVar17 = -1;
          }
          uVar3 = (int)fVar24 + 1U;
          if ((int)auVar26._0_4_ < (int)((int)fVar24 + 1U)) {
            uVar3 = (int)auVar26._0_4_;
          }
          lVar13 = (long)(int)auVar71._0_4_;
          pcVar5 = pBVar4[lVar13].super_RawBufferView.ptr_ofs;
          sVar6 = pBVar4[lVar13].super_RawBufferView.stride;
          lVar22 = sVar6 * uVar15;
          lVar21 = sVar6 * uVar16;
          auVar47 = ZEXT816(0) << 0x40;
          auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),
                               *(undefined1 (*) [16])(pcVar5 + lVar21));
          auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),
                               *(undefined1 (*) [16])(pcVar5 + lVar21));
          fVar1 = (this->super_LineSegments).maxRadiusScale;
          auVar32 = vmaxss_avx(ZEXT416(*(uint *)(pcVar5 + lVar21 + 0xc)),
                               ZEXT416(*(uint *)(pcVar5 + lVar22 + 0xc)));
          fVar48 = auVar32._0_4_ * fVar1;
          auVar73._4_4_ = fVar48;
          auVar73._0_4_ = fVar48;
          auVar73._8_4_ = fVar48;
          auVar73._12_4_ = fVar48;
          auVar73 = vsubps_avx(auVar26,auVar73);
          auVar74._0_4_ = fVar48 + auVar25._0_4_;
          auVar74._4_4_ = fVar48 + auVar25._4_4_;
          auVar74._8_4_ = fVar48 + auVar25._8_4_;
          auVar74._12_4_ = fVar48 + auVar25._12_4_;
          lVar21 = (long)(int)fVar43;
          pcVar5 = pBVar4[lVar21].super_RawBufferView.ptr_ofs;
          sVar6 = pBVar4[lVar21].super_RawBufferView.stride;
          lVar23 = sVar6 * uVar15;
          lVar22 = sVar6 * uVar16;
          auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar5 + lVar23),
                               *(undefined1 (*) [16])(pcVar5 + lVar22));
          auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar5 + lVar23),
                               *(undefined1 (*) [16])(pcVar5 + lVar22));
          auVar32 = vmaxss_avx(ZEXT416(*(uint *)(pcVar5 + lVar22 + 0xc)),
                               ZEXT416(*(uint *)(pcVar5 + lVar23 + 0xc)));
          fVar48 = fVar1 * auVar32._0_4_;
          auVar56._4_4_ = fVar48;
          auVar56._0_4_ = fVar48;
          auVar56._8_4_ = fVar48;
          auVar56._12_4_ = fVar48;
          auVar32 = vsubps_avx(auVar26,auVar56);
          auVar51._0_4_ = auVar25._0_4_ + fVar48;
          auVar51._4_4_ = auVar25._4_4_ + fVar48;
          auVar51._8_4_ = auVar25._8_4_ + fVar48;
          auVar51._12_4_ = auVar25._12_4_ + fVar48;
          auVar71 = ZEXT416((uint)(fVar10 - auVar71._0_4_));
          if (uVar3 - iVar17 == 1) {
            auVar71 = vmaxss_avx(auVar71,auVar47);
            fVar24 = auVar71._0_4_;
            fVar10 = 1.0 - fVar24;
            auVar50._0_4_ = fVar24 * auVar32._0_4_;
            auVar50._4_4_ = fVar24 * auVar32._4_4_;
            auVar50._8_4_ = fVar24 * auVar32._8_4_;
            auVar50._12_4_ = fVar24 * auVar32._12_4_;
            auVar33._4_4_ = fVar10;
            auVar33._0_4_ = fVar10;
            auVar33._8_4_ = fVar10;
            auVar33._12_4_ = fVar10;
            auVar77 = vfmadd231ps_fma(auVar50,auVar33,auVar73);
            auVar27._0_4_ = fVar24 * auVar51._0_4_;
            auVar27._4_4_ = fVar24 * auVar51._4_4_;
            auVar27._8_4_ = fVar24 * auVar51._8_4_;
            auVar27._12_4_ = fVar24 * auVar51._12_4_;
            auVar75 = vfmadd231ps_fma(auVar27,auVar74,auVar33);
            auVar71 = vmaxss_avx(ZEXT416((uint)(fVar43 - fVar31)),auVar47);
            fVar31 = auVar71._0_4_;
            fVar10 = 1.0 - fVar31;
            auVar44._0_4_ = auVar73._0_4_ * fVar31;
            auVar44._4_4_ = auVar73._4_4_ * fVar31;
            auVar44._8_4_ = auVar73._8_4_ * fVar31;
            auVar44._12_4_ = auVar73._12_4_ * fVar31;
            auVar38._4_4_ = fVar10;
            auVar38._0_4_ = fVar10;
            auVar38._8_4_ = fVar10;
            auVar38._12_4_ = fVar10;
            auVar47 = vfmadd213ps_fma(auVar32,auVar38,auVar44);
            auVar34._0_4_ = auVar74._0_4_ * fVar31;
            auVar34._4_4_ = auVar74._4_4_ * fVar31;
            auVar34._8_4_ = auVar74._8_4_ * fVar31;
            auVar34._12_4_ = auVar74._12_4_ * fVar31;
            auVar52 = vfmadd213ps_fma(auVar51,auVar38,auVar34);
          }
          else {
            pcVar5 = pBVar4[lVar13 + 1].super_RawBufferView.ptr_ofs;
            sVar6 = pBVar4[lVar13 + 1].super_RawBufferView.stride;
            lVar22 = sVar6 * uVar15;
            lVar13 = sVar6 * uVar16;
            auVar56 = vminps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),
                                 *(undefined1 (*) [16])(pcVar5 + lVar13));
            auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar5 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar5 + lVar22 + 0xc)));
            auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),
                                 *(undefined1 (*) [16])(pcVar5 + lVar13));
            fVar10 = auVar26._0_4_ * fVar1;
            auVar57._4_4_ = fVar10;
            auVar57._0_4_ = fVar10;
            auVar57._8_4_ = fVar10;
            auVar57._12_4_ = fVar10;
            auVar77 = vsubps_avx(auVar56,auVar57);
            pcVar5 = pBVar4[lVar21 + -1].super_RawBufferView.ptr_ofs;
            sVar6 = pBVar4[lVar21 + -1].super_RawBufferView.stride;
            lVar21 = sVar6 * uVar15;
            lVar13 = sVar6 * uVar16;
            auVar52 = vminps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),
                                 *(undefined1 (*) [16])(pcVar5 + lVar13));
            auVar56 = vmaxss_avx(ZEXT416(*(uint *)(pcVar5 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar5 + lVar21 + 0xc)));
            auVar26 = vmaxps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),
                                 *(undefined1 (*) [16])(pcVar5 + lVar13));
            fVar48 = fVar1 * auVar56._0_4_;
            auVar39._4_4_ = fVar48;
            auVar39._0_4_ = fVar48;
            auVar39._8_4_ = fVar48;
            auVar39._12_4_ = fVar48;
            auVar56 = vsubps_avx(auVar52,auVar39);
            auVar71 = vmaxss_avx(auVar71,auVar47);
            fVar30 = auVar71._0_4_;
            fVar49 = 1.0 - fVar30;
            auVar63._0_4_ = auVar77._0_4_ * fVar30;
            auVar63._4_4_ = auVar77._4_4_ * fVar30;
            auVar63._8_4_ = auVar77._8_4_ * fVar30;
            auVar63._12_4_ = auVar77._12_4_ * fVar30;
            auVar58._4_4_ = fVar49;
            auVar58._0_4_ = fVar49;
            auVar58._8_4_ = fVar49;
            auVar58._12_4_ = fVar49;
            auVar77 = vfmadd213ps_fma(auVar73,auVar58,auVar63);
            auVar35._0_4_ = fVar30 * (auVar25._0_4_ + fVar10);
            auVar35._4_4_ = fVar30 * (auVar25._4_4_ + fVar10);
            auVar35._8_4_ = fVar30 * (auVar25._8_4_ + fVar10);
            auVar35._12_4_ = fVar30 * (auVar25._12_4_ + fVar10);
            auVar75 = vfmadd213ps_fma(auVar74,auVar58,auVar35);
            auVar71 = vmaxss_avx(ZEXT416((uint)(fVar43 - fVar31)),ZEXT816(0) << 0x20);
            fVar31 = auVar71._0_4_;
            fVar10 = 1.0 - fVar31;
            auVar28._0_4_ = fVar31 * auVar56._0_4_;
            auVar28._4_4_ = fVar31 * auVar56._4_4_;
            auVar28._8_4_ = fVar31 * auVar56._8_4_;
            auVar28._12_4_ = fVar31 * auVar56._12_4_;
            auVar45._4_4_ = fVar10;
            auVar45._0_4_ = fVar10;
            auVar45._8_4_ = fVar10;
            auVar45._12_4_ = fVar10;
            auVar47 = vfmadd213ps_fma(auVar32,auVar45,auVar28);
            auVar29._0_4_ = fVar31 * (auVar26._0_4_ + fVar48);
            auVar29._4_4_ = fVar31 * (auVar26._4_4_ + fVar48);
            auVar29._8_4_ = fVar31 * (auVar26._8_4_ + fVar48);
            auVar29._12_4_ = fVar31 * (auVar26._12_4_ + fVar48);
            auVar52 = vfmadd213ps_fma(auVar51,auVar45,auVar29);
            uVar18 = iVar17 + 1;
            if ((int)uVar18 < (int)uVar3) {
              psVar14 = &pBVar4[uVar18].super_RawBufferView.stride;
              auVar71 = auVar77;
              auVar25 = auVar75;
              do {
                fVar31 = ((float)(int)uVar18 / fVar24 - fVar70) / (fVar37 - fVar70);
                fVar10 = 1.0 - fVar31;
                auVar46._0_4_ = auVar47._0_4_ * fVar31;
                fVar43 = auVar47._4_4_;
                auVar46._4_4_ = fVar43 * fVar31;
                fVar48 = auVar47._8_4_;
                auVar46._8_4_ = fVar48 * fVar31;
                fVar49 = auVar47._12_4_;
                auVar46._12_4_ = fVar49 * fVar31;
                auVar40._4_4_ = fVar10;
                auVar40._0_4_ = fVar10;
                auVar40._8_4_ = fVar10;
                auVar40._12_4_ = fVar10;
                auVar51 = vfmadd231ps_fma(auVar46,auVar40,auVar71);
                auVar36._0_4_ = auVar52._0_4_ * fVar31;
                fVar30 = auVar52._4_4_;
                auVar36._4_4_ = fVar30 * fVar31;
                fVar54 = auVar52._8_4_;
                auVar36._8_4_ = fVar54 * fVar31;
                fVar55 = auVar52._12_4_;
                auVar36._12_4_ = fVar55 * fVar31;
                auVar56 = vfmadd231ps_fma(auVar36,auVar25,auVar40);
                pcVar5 = ((RawBufferView *)(psVar14 + -2))->ptr_ofs;
                lVar21 = *psVar14 * uVar15;
                lVar13 = *psVar14 * uVar16;
                auVar73 = vminps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),
                                     *(undefined1 (*) [16])(pcVar5 + lVar13));
                auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar5 + lVar13 + 0xc)),
                                     ZEXT416(*(uint *)(pcVar5 + lVar21 + 0xc)));
                auVar32 = vmaxps_avx(*(undefined1 (*) [16])(pcVar5 + lVar21),
                                     *(undefined1 (*) [16])(pcVar5 + lVar13));
                fVar10 = auVar26._0_4_ * fVar1;
                auVar59._4_4_ = fVar10;
                auVar59._0_4_ = fVar10;
                auVar59._8_4_ = fVar10;
                auVar59._12_4_ = fVar10;
                auVar26 = vsubps_avx(auVar73,auVar59);
                auVar26 = vsubps_avx(auVar26,auVar51);
                auVar41._0_4_ = auVar32._0_4_ + fVar10;
                auVar41._4_4_ = auVar32._4_4_ + fVar10;
                auVar41._8_4_ = auVar32._8_4_ + fVar10;
                auVar41._12_4_ = auVar32._12_4_ + fVar10;
                auVar32 = vsubps_avx(auVar41,auVar56);
                auVar26 = vminps_avx(auVar26,ZEXT816(0));
                auVar32 = vmaxps_avx(auVar32,ZEXT816(0));
                auVar77._0_4_ = auVar71._0_4_ + auVar26._0_4_;
                auVar77._4_4_ = auVar71._4_4_ + auVar26._4_4_;
                auVar77._8_4_ = auVar71._8_4_ + auVar26._8_4_;
                auVar77._12_4_ = auVar71._12_4_ + auVar26._12_4_;
                auVar47._0_4_ = auVar47._0_4_ + auVar26._0_4_;
                auVar47._4_4_ = fVar43 + auVar26._4_4_;
                auVar47._8_4_ = fVar48 + auVar26._8_4_;
                auVar47._12_4_ = fVar49 + auVar26._12_4_;
                auVar75._0_4_ = auVar25._0_4_ + auVar32._0_4_;
                auVar75._4_4_ = auVar25._4_4_ + auVar32._4_4_;
                auVar75._8_4_ = auVar25._8_4_ + auVar32._8_4_;
                auVar75._12_4_ = auVar25._12_4_ + auVar32._12_4_;
                auVar52._0_4_ = auVar52._0_4_ + auVar32._0_4_;
                auVar52._4_4_ = fVar30 + auVar32._4_4_;
                auVar52._8_4_ = fVar54 + auVar32._8_4_;
                auVar52._12_4_ = fVar55 + auVar32._12_4_;
                uVar18 = uVar18 + 1;
                psVar14 = psVar14 + 7;
                auVar71 = auVar77;
                auVar25 = auVar75;
              } while (uVar3 != uVar18);
            }
          }
          auVar71 = vmaxps_avx(auVar75,auVar52);
          auVar25 = vminps_avx(auVar77,auVar47);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
          aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar71,ZEXT416((uint)uVar12),0x30);
          auVar71 = vminps_avx(auVar76._0_16_,(undefined1  [16])aVar8);
          auVar76 = ZEXT1664(auVar71);
          auVar71 = vmaxps_avx(auVar72._0_16_,(undefined1  [16])aVar9);
          auVar72 = ZEXT1664(auVar71);
          auVar42._0_4_ = aVar8.x + aVar9.x;
          auVar42._4_4_ = aVar8.y + aVar9.y;
          auVar42._8_4_ = aVar8.z + aVar9.z;
          auVar42._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
          auVar71 = vminps_avx(auVar62._0_16_,auVar42);
          auVar62 = ZEXT1664(auVar71);
          auVar71 = vmaxps_avx(auVar66._0_16_,auVar42);
          auVar66 = ZEXT1664(auVar71);
          sVar11 = sVar11 + 1;
          prims[k].lower.field_0.field_1 = aVar8;
          prims[k].upper.field_0.field_1 = aVar9;
          uVar19 = r->_end;
          auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar68 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar69 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
LAB_0198ed5c:
        aVar64 = auVar66._0_16_;
        aVar60 = auVar62._0_16_;
        aVar65 = auVar72._0_16_;
        aVar61 = auVar76._0_16_;
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar19);
    }
    else {
      sVar11 = 0;
      aVar65.m128[2] = -INFINITY;
      aVar65._0_8_ = 0xff800000ff800000;
      aVar65.m128[3] = -INFINITY;
      aVar61.m128[2] = INFINITY;
      aVar61._0_8_ = 0x7f8000007f800000;
      aVar61.m128[3] = INFINITY;
      aVar60 = aVar61;
      aVar64 = aVar65;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar61;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar65;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar60;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar64;
    __return_storage_ptr__->end = sVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }